

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O0

void __thiscall ParserTest_Paragraph_Test::TestBody(ParserTest_Paragraph_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char (*in_stack_fffffffffffffe98) [12];
  string *expected;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int line;
  char *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Type type;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  string local_108 [16];
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e8 [2];
  char *in_stack_ffffffffffffff38;
  AssertionResult local_a8 [2];
  string local_88 [32];
  AssertionResult local_68 [3];
  string local_38 [32];
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff38);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    testing::AssertionResult::failure_message((AssertionResult *)0x10bf0b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),type,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x10bf68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bfbd);
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff38);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_88);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x10c09b);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffec0),type,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x10c0f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c14d);
  pcVar4 = &stack0xffffffffffffff38;
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff38);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,(char (*) [9])in_stack_fffffffffffffe98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10c22b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffec0),type,pcVar4,line,
               in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x10c288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c2dd);
  expected = local_108;
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff38);
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0,
             (char (*) [14])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_108);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
    testing::AssertionResult::failure_message((AssertionResult *)0x10c3af);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffec0),type,pcVar4,line,
               in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x10c3fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c44a);
  return;
}

Assistant:

TEST(ParserTest, Paragraph) {
  EXPECT_EQ("<p>test</p>", Parse("test"));
  EXPECT_EQ("<p>test</p>", Parse("\ntest"));
  EXPECT_EQ("<p>.</p>", Parse("."));
  EXPECT_EQ("<p>..test</p>", Parse("..test"));
}